

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O2

void HorizontalFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  int iVar1;
  long lVar2;
  uint8_t *dst;
  
  *filtered_data = *data;
  PredictLineLeft_SSE2(data + 1,filtered_data + 1,width + -1);
  lVar2 = (long)stride;
  dst = filtered_data + lVar2 + 1;
  for (iVar1 = 1; iVar1 < height; iVar1 = iVar1 + 1) {
    dst[-1] = data[lVar2] - *data;
    PredictLineLeft_SSE2(data + lVar2 + 1,dst,width + -1);
    dst = dst + lVar2;
    data = data + lVar2;
  }
  return;
}

Assistant:

static void HorizontalFilter_SSE2(const uint8_t* data, int width, int height,
                                  int stride, uint8_t* filtered_data) {
  DoHorizontalFilter_SSE2(data, width, height, stride, 0, height,
                          filtered_data);
}